

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

char * read_multi_note(Lexer *lexer,CharBuff *buff)

{
  uint chr_00;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int op;
  int chr;
  CharBuff *buff_local;
  Lexer *lexer_local;
  
LAB_00102890:
  do {
    chr_00 = read_chr(lexer);
    if (chr_00 == 0) {
LAB_0010294e:
      pcVar3 = to_string(buff);
      return pcVar3;
    }
    if (chr_00 != 0x2a) {
LAB_001028e6:
      iVar2 = is_new_line(chr_00);
      if (iVar2 != 0) {
        lexer->row_pos = lexer->row_pos + 1;
        lexer->col_pos = 1;
      }
      if (chr_00 == 0xc9) {
        pcVar3 = to_string(buff);
        lexer_error("note is not closed normally",pcVar3,lexer->row_pos,lexer->col_pos);
      }
      append_chr(buff,(char)chr_00);
      goto LAB_00102890;
    }
    uVar1 = read_chr(lexer);
    if (uVar1 != 0x2a) {
      if (uVar1 != 0x2f) goto LAB_001028e6;
      goto LAB_0010294e;
    }
    append_chr(buff,(char)chr_00);
    unread_chr(lexer,0x2a);
  } while( true );
}

Assistant:

char *read_multi_note(Lexer *lexer, CharBuff* buff) {
    int chr;
    int op;
    while ((chr = read_chr(lexer))) {
        if (chr == '*') {
            op = read_chr(lexer);
            // 可能下一个还是 * 那么记录下一个星
            if (op == '*') {
                append_chr(buff, (char) chr);
                unread_chr(lexer, op);
                continue;
            } else if (op == '/') {
                break;
            }
        }
        if (is_new_line(chr)) {
            lexer->row_pos++;
            lexer->col_pos = 1;
        }
        if (chr == END) {
            lexer_error("note is not closed normally",
                        to_string(buff),
                        lexer->row_pos,
                        lexer->col_pos);
        }
        append_chr(buff, (char) chr);
    }
    return to_string(buff);
}